

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqapi.cpp
# Opt level: O2

SQRESULT sq_arraypop(HSQUIRRELVM v,SQInteger idx,SQBool pushval)

{
  bool bVar1;
  SQObjectPtr *in_RAX;
  SQOuter *this;
  SQRESULT SVar2;
  SQObjectPtr *arr;
  
  if (v->_stackbase < v->_top) {
    arr = in_RAX;
    bVar1 = sq_aux_gettypedarg(v,idx,OT_ARRAY,&arr);
    SVar2 = -1;
    if (bVar1) {
      this = (arr->super_SQObject)._unVal.pOuter;
      if (this->_idx < 1) {
        sq_throwerror(v,"empty array");
      }
      else {
        if (pushval != 0) {
          SQVM::Push(v,((SQObjectPtrVec *)&this->_valptr)->_vals + (this->_idx - 1));
          this = (SQOuter *)(arr->super_SQObject)._unVal.pArray;
        }
        SQArray::Pop((SQArray *)this);
        SVar2 = 0;
      }
    }
  }
  else {
    SQVM::Raise_Error(v,"not enough params in the stack");
    SVar2 = -1;
  }
  return SVar2;
}

Assistant:

SQRESULT sq_arraypop(HSQUIRRELVM v,SQInteger idx,SQBool pushval)
{
    sq_aux_paramscheck(v, 1);
    SQObjectPtr *arr;
    _GETSAFE_OBJ(v, idx, OT_ARRAY,arr);
    if(_array(*arr)->Size() > 0) {
        if(pushval != 0){ v->Push(_array(*arr)->Top()); }
        _array(*arr)->Pop();
        return SQ_OK;
    }
    return sq_throwerror(v, _SC("empty array"));
}